

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::IsInternallyOn(char *val)

{
  int iVar1;
  size_t sVar2;
  long *plVar3;
  bool bVar4;
  string v;
  long *local_38;
  ulong local_30;
  long local_28 [2];
  
  if (val == (char *)0x0) {
    bVar4 = false;
  }
  else {
    local_38 = local_28;
    sVar2 = strlen(val);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,val,val + sVar2);
    if (local_30 < 5) {
      plVar3 = local_38;
      if (local_30 != 0) {
        do {
          iVar1 = toupper((int)(char)*plVar3);
          *(char *)plVar3 = (char)iVar1;
          plVar3 = (long *)((long)plVar3 + 1);
        } while (plVar3 != (long *)((long)local_38 + local_30));
      }
      iVar1 = std::__cxx11::string::compare((char *)&local_38);
      bVar4 = iVar1 == 0;
    }
    else {
      bVar4 = false;
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmSystemTools::IsInternallyOn(const char* val)
{
  if (!val) {
    return false;
  }
  std::string v = val;
  if (v.size() > 4) {
    return false;
  }

  for (std::string::iterator c = v.begin(); c != v.end(); c++) {
    *c = static_cast<char>(toupper(*c));
  }
  return v == "I_ON";
}